

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1b21075::PeerManagerImpl::ProcessMessages
          (PeerManagerImpl *this,CNode *pfrom,atomic<bool> *interruptMsgProc)

{
  long lVar1;
  Span<const_unsigned_char> __args_2;
  bool bVar2;
  bool bVar3;
  element_type *peVar4;
  pair<CNetMessage,_bool> *vRecv;
  pair<CNetMessage,_bool> *ppVar5;
  atomic<bool> *in_RDX;
  CNode *in_RSI;
  PeerManagerImpl *in_RDI;
  long in_FS_OFFSET;
  exception *e;
  bool fMoreWork;
  CNetMessage *msg;
  bool processed_orphan;
  PeerRef peer;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock109;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock108;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock107;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock106;
  optional<std::pair<CNetMessage,_bool>_> poll_result;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  TxOrphanage *in_stack_fffffffffffffd78;
  function<void_(const_CAddress_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_Span<const_unsigned_char>,_bool)>
  *in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd8b;
  int in_stack_fffffffffffffd8c;
  uchar *in_stack_fffffffffffffd90;
  PeerManagerImpl *in_stack_fffffffffffffd98;
  AnnotatedMixin<std::mutex> *in_stack_fffffffffffffda0;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_fffffffffffffda8;
  CNode *in_stack_fffffffffffffdb8;
  PeerManagerImpl *in_stack_fffffffffffffe10;
  atomic<bool> *in_stack_fffffffffffffe20;
  Peer *in_stack_fffffffffffffe28;
  CNode *in_stack_fffffffffffffe30;
  PeerManagerImpl *in_stack_fffffffffffffe38;
  byte local_1b1;
  byte local_171;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            ((char *)in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70,
             in_stack_fffffffffffffd6c,(Mutex *)0x10714e3);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70,
             in_stack_fffffffffffffd6c,(AnnotatedMixin<std::mutex> *)0x1071502);
  CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  GetPeerRef(in_stack_fffffffffffffd98,(NodeId)in_stack_fffffffffffffdb8);
  bVar2 = std::operator==((shared_ptr<(anonymous_namespace)::Peer> *)in_stack_fffffffffffffd78,
                          in_stack_fffffffffffffd70);
  if (bVar2) {
    local_171 = 0;
  }
  else {
    bVar2 = CNode::IsInboundConn
                      ((CNode *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    if ((bVar2) ||
       (peVar4 = std::
                 __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68)),
       (peVar4->m_outbound_version_message_sent & 1U) != 0)) {
      std::
      __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                 (char *)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                 in_stack_fffffffffffffd8c,(bool)in_stack_fffffffffffffd8b);
      std::
      __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      bVar2 = std::deque<CInv,_std::allocator<CInv>_>::empty
                        ((deque<CInv,_std::allocator<CInv>_> *)
                         CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      if (!bVar2) {
        std::
        __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_fffffffffffffd78);
        ProcessGetData(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28
                       ,in_stack_fffffffffffffe20);
      }
      UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
                 CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      std::
      __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)in_stack_fffffffffffffd78);
      bVar2 = ProcessOrphanTx(in_stack_fffffffffffffe10,(Peer *)in_RDI);
      bVar3 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffd80);
      if (bVar3) {
        local_171 = 0;
      }
      else if (bVar2) {
        local_171 = 1;
      }
      else {
        std::
        __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
        MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
        UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                  (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                   (char *)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                   in_stack_fffffffffffffd8c,(bool)in_stack_fffffffffffffd8b);
        std::
        __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
        bVar2 = std::deque<CInv,_std::allocator<CInv>_>::empty
                          ((deque<CInv,_std::allocator<CInv>_> *)
                           CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
        if (!bVar2) {
          local_171 = 1;
        }
        UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
                   CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
        if (bVar2) {
          bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffd80);
          if (bVar2) {
            local_171 = 0;
          }
          else {
            CNode::PollMessage(in_stack_fffffffffffffdb8);
            bVar2 = std::optional::operator_cast_to_bool
                              ((optional<std::pair<CNetMessage,_bool>_> *)
                               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
            if (bVar2) {
              vRecv = std::optional<std::pair<CNetMessage,_bool>_>::operator->
                                ((optional<std::pair<CNetMessage,_bool>_> *)
                                 CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
              ppVar5 = std::optional<std::pair<CNetMessage,_bool>_>::operator->
                                 ((optional<std::pair<CNetMessage,_bool>_> *)
                                  CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
              local_1b1 = ppVar5->second & 1;
              if (((in_RDI->m_opts).capture_messages & 1U) != 0) {
                MakeUCharSpan<DataStream&>((DataStream *)in_stack_fffffffffffffd78);
                Span<const_unsigned_char>::Span<unsigned_char,_0>
                          ((Span<const_unsigned_char> *)
                           CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                           (Span<unsigned_char> *)0x10718ec);
                __args_2.m_size = (size_t)in_stack_fffffffffffffd98;
                __args_2.m_data = in_stack_fffffffffffffd90;
                std::
                function<void_(const_CAddress_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_Span<const_unsigned_char>,_bool)>
                ::operator()(in_stack_fffffffffffffd80,(CAddress *)in_stack_fffffffffffffd78,
                             in_stack_fffffffffffffd70,__args_2,
                             SUB41((uint)in_stack_fffffffffffffd8c >> 0x18,0));
              }
              ProcessMessage(in_RDI,in_RSI,&(vRecv->first).m_type,(DataStream *)vRecv,
                             (microseconds)(vRecv->first).m_time.__r,in_RDX);
              bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffd80);
              if (bVar2) {
                local_171 = 0;
              }
              else {
                std::
                __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
                MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffd6c,
                                                    in_stack_fffffffffffffd68));
                UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                          (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                           (char *)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                           in_stack_fffffffffffffd8c,(bool)in_stack_fffffffffffffd8b);
                std::
                __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
                bVar2 = std::deque<CInv,_std::allocator<CInv>_>::empty
                                  ((deque<CInv,_std::allocator<CInv>_> *)
                                   CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
                if (!bVar2) {
                  local_1b1 = 1;
                }
                UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
                          ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
                           CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
                MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffd6c,
                                                    in_stack_fffffffffffffd68));
                UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                          (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                           (char *)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
                           in_stack_fffffffffffffd8c,(bool)in_stack_fffffffffffffd8b);
                std::
                __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
                bVar2 = TxOrphanage::HaveTxToReconsider
                                  (in_stack_fffffffffffffd78,(NodeId)in_stack_fffffffffffffd98);
                if (bVar2) {
                  local_1b1 = 1;
                }
                UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
                          ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
                           CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
                local_171 = local_1b1;
              }
            }
            else {
              local_171 = 0;
            }
            std::optional<std::pair<CNetMessage,_bool>_>::~optional
                      ((optional<std::pair<CNetMessage,_bool>_> *)
                       CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
          }
        }
      }
    }
    else {
      local_171 = 0;
    }
  }
  std::shared_ptr<(anonymous_namespace)::Peer>::~shared_ptr
            ((shared_ptr<(anonymous_namespace)::Peer> *)
             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(local_171 & 1);
}

Assistant:

bool PeerManagerImpl::ProcessMessages(CNode* pfrom, std::atomic<bool>& interruptMsgProc)
{
    AssertLockNotHeld(m_tx_download_mutex);
    AssertLockHeld(g_msgproc_mutex);

    PeerRef peer = GetPeerRef(pfrom->GetId());
    if (peer == nullptr) return false;

    // For outbound connections, ensure that the initial VERSION message
    // has been sent first before processing any incoming messages
    if (!pfrom->IsInboundConn() && !peer->m_outbound_version_message_sent) return false;

    {
        LOCK(peer->m_getdata_requests_mutex);
        if (!peer->m_getdata_requests.empty()) {
            ProcessGetData(*pfrom, *peer, interruptMsgProc);
        }
    }

    const bool processed_orphan = ProcessOrphanTx(*peer);

    if (pfrom->fDisconnect)
        return false;

    if (processed_orphan) return true;

    // this maintains the order of responses
    // and prevents m_getdata_requests to grow unbounded
    {
        LOCK(peer->m_getdata_requests_mutex);
        if (!peer->m_getdata_requests.empty()) return true;
    }

    // Don't bother if send buffer is too full to respond anyway
    if (pfrom->fPauseSend) return false;

    auto poll_result{pfrom->PollMessage()};
    if (!poll_result) {
        // No message to process
        return false;
    }

    CNetMessage& msg{poll_result->first};
    bool fMoreWork = poll_result->second;

    TRACE6(net, inbound_message,
        pfrom->GetId(),
        pfrom->m_addr_name.c_str(),
        pfrom->ConnectionTypeAsString().c_str(),
        msg.m_type.c_str(),
        msg.m_recv.size(),
        msg.m_recv.data()
    );

    if (m_opts.capture_messages) {
        CaptureMessage(pfrom->addr, msg.m_type, MakeUCharSpan(msg.m_recv), /*is_incoming=*/true);
    }

    try {
        ProcessMessage(*pfrom, msg.m_type, msg.m_recv, msg.m_time, interruptMsgProc);
        if (interruptMsgProc) return false;
        {
            LOCK(peer->m_getdata_requests_mutex);
            if (!peer->m_getdata_requests.empty()) fMoreWork = true;
        }
        // Does this peer has an orphan ready to reconsider?
        // (Note: we may have provided a parent for an orphan provided
        //  by another peer that was already processed; in that case,
        //  the extra work may not be noticed, possibly resulting in an
        //  unnecessary 100ms delay)
        LOCK(m_tx_download_mutex);
        if (m_orphanage.HaveTxToReconsider(peer->m_id)) fMoreWork = true;
    } catch (const std::exception& e) {
        LogDebug(BCLog::NET, "%s(%s, %u bytes): Exception '%s' (%s) caught\n", __func__, SanitizeString(msg.m_type), msg.m_message_size, e.what(), typeid(e).name());
    } catch (...) {
        LogDebug(BCLog::NET, "%s(%s, %u bytes): Unknown exception caught\n", __func__, SanitizeString(msg.m_type), msg.m_message_size);
    }

    return fMoreWork;
}